

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O2

RTPTransmissionInfo * __thiscall
jrtplib::RTPExternalTransmitter::GetTransmissionInfo(RTPExternalTransmitter *this)

{
  RTPTransmissionInfo *pRVar1;
  
  if (this->init == true) {
    pRVar1 = (RTPTransmissionInfo *)
             operator_new(0x18,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0x1c);
    pRVar1->protocol = ExternalProto;
    pRVar1->_vptr_RTPTransmissionInfo = (_func_int **)&PTR__RTPTransmissionInfo_00145638;
    pRVar1[1]._vptr_RTPTransmissionInfo = (_func_int **)&this->packetinjector;
    return pRVar1;
  }
  return (RTPTransmissionInfo *)0x0;
}

Assistant:

RTPTransmissionInfo *RTPExternalTransmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPExternalTransmissionInfo(&packetinjector);
	MAINMUTEX_UNLOCK
	return tinf;
}